

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::CodedOutputStreamFieldSkipper::SkipUnknownEnum
          (CodedOutputStreamFieldSkipper *this,int field_number,int value)

{
  CodedOutputStream *pCVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint8 *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  pCVar1 = this->unknown_fields_;
  if ((pCVar1->impl_).end_ <= pCVar1->cur_) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&pCVar1->impl_,pCVar1->cur_);
    pCVar1->cur_ = puVar6;
  }
  pbVar4 = pCVar1->cur_;
  if ((uint)field_number < 0x80) {
    *pbVar4 = (byte)field_number;
    pbVar4 = pbVar4 + 1;
  }
  else {
    *pbVar4 = (byte)field_number | 0x80;
    if ((uint)field_number < 0x4000) {
      pbVar4[1] = (byte)((uint)field_number >> 7);
      pbVar4 = pbVar4 + 2;
    }
    else {
      pbVar4 = pbVar4 + 2;
      uVar3 = (uint)field_number >> 7;
      do {
        pbVar5 = pbVar4;
        pbVar5[-1] = (byte)uVar3 | 0x80;
        uVar7 = uVar3 >> 7;
        pbVar4 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar3;
        uVar3 = uVar7;
      } while (bVar2);
      *pbVar5 = (byte)uVar7;
    }
  }
  pCVar1->cur_ = pbVar4;
  pCVar1 = this->unknown_fields_;
  if ((pCVar1->impl_).end_ <= pCVar1->cur_) {
    puVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&pCVar1->impl_,pCVar1->cur_);
    pCVar1->cur_ = puVar6;
  }
  pbVar4 = pCVar1->cur_;
  if ((uint)value < 0x80) {
    *pbVar4 = (byte)value;
    pbVar4 = pbVar4 + 1;
  }
  else {
    *pbVar4 = (byte)value | 0x80;
    if ((uint)value < 0x4000) {
      pbVar4[1] = (byte)((ulong)(long)value >> 7);
      pbVar4 = pbVar4 + 2;
    }
    else {
      pbVar4 = pbVar4 + 2;
      uVar8 = (ulong)(long)value >> 7;
      do {
        pbVar5 = pbVar4;
        pbVar5[-1] = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar4 = pbVar5 + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar2);
      *pbVar5 = (byte)uVar9;
    }
  }
  pCVar1->cur_ = pbVar4;
  return;
}

Assistant:

void CodedOutputStreamFieldSkipper::SkipUnknownEnum(int field_number,
                                                    int value) {
  unknown_fields_->WriteVarint32(field_number);
  unknown_fields_->WriteVarint64(value);
}